

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O2

void __thiscall NLReaderTest_ReadVarArgExpr_Test::TestBody(NLReaderTest_ReadVarArgExpr_Test *this)

{
  bool bVar1;
  char *pcVar2;
  allocator<char> local_10a;
  allocator<char> local_109;
  string gtest_expected_message;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_2,"v0 <= 0; v1 <= 0; v2 <= 0; v3 <= 0; v4 <= 0; ",&local_109);
  std::operator+(&gtest_expected_message,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2,
                 "c0: v11(v4, 5, v1);");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"C0\no11\n3\nv4\nn5\nv1\n",&local_10a);
  ReadNL(&local_b8,&local_58,true);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,
             "std::string(\"v0 <= 0; v1 <= 0; v2 <= 0; v3 <= 0; v4 <= 0; \") + \"c0: v11(v4, 5, v1);\""
             ,"ReadNL(\"C0\\no11\\n3\\nv4\\nn5\\nv1\\n\")",&gtest_expected_message,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x49f,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_2,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_2,"v0 <= 0; v1 <= 0; v2 <= 0; v3 <= 0; v4 <= 0; ",&local_109);
  std::operator+(&gtest_expected_message,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_2,
                 "c0: v12(v4);");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"C0\no12\n1\nv4\n",&local_10a);
  ReadNL(&local_b8,&local_78,true);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,
             "std::string(\"v0 <= 0; v1 <= 0; v2 <= 0; v3 <= 0; v4 <= 0; \") + \"c0: v12(v4);\"",
             "ReadNL(\"C0\\no12\\n1\\nv4\\n\")",&gtest_expected_message,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0x4a0,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_2,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar_2.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_expected_message,"(input):19:1: too few arguments",
               (allocator<char> *)&local_b8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"C0\no12\n0\n",(allocator<char> *)&local_b8);
      ReadNL(&local_38,&local_98,true);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_98);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar_2,
               (char (*) [101])
               "Expected: ReadNL(\"C0\\no12\\n0\\n\") throws an exception of type ReadError.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar_2.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x4a1,pcVar2);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&local_b8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  return;
}

Assistant:

TEST(NLReaderTest, ReadVarArgExpr) {
  EXPECT_READ("c0: v11(v4, 5, v1);", "C0\no11\n3\nv4\nn5\nv1\n");
  EXPECT_READ("c0: v12(v4);", "C0\no12\n1\nv4\n");
  EXPECT_READ_ERROR("C0\no12\n0\n" , "(input):19:1: too few arguments");
}